

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_poll_add(intptr_t fd)

{
  int iVar1;
  
  iVar1 = fio_poll_add2((int)fd,0x40002011,evio_fd[1]);
  if (iVar1 != -1) {
    fio_poll_add2((int)fd,0x40002014,evio_fd[2]);
    return;
  }
  return;
}

Assistant:

static inline void fio_poll_add(intptr_t fd) {
  if (fio_poll_add2(fd, (EPOLLIN | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                    evio_fd[1]) == -1)
    return;
  fio_poll_add2(fd, (EPOLLOUT | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                evio_fd[2]);
  return;
}